

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_7c221d::CodemodelConfig::DumpProject
          (Value *__return_storage_ptr__,CodemodelConfig *this,Project *p)

{
  bool bVar1;
  Value *pVVar2;
  Value local_120;
  Value local_f8;
  Value local_d0;
  Value local_a8;
  string local_70;
  Value local_50;
  undefined1 local_21;
  Project *local_20;
  Project *p_local;
  CodemodelConfig *this_local;
  Value *project;
  
  local_21 = 0;
  local_20 = p;
  p_local = (Project *)this;
  this_local = (CodemodelConfig *)__return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  cmStateSnapshot::GetProjectName_abi_cxx11_(&local_70,&local_20->Snapshot);
  Json::Value::Value(&local_50,&local_70);
  pVVar2 = Json::Value::operator[](__return_storage_ptr__,"name");
  Json::Value::operator=(pVVar2,&local_50);
  Json::Value::~Value(&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  if (local_20->ParentIndex != 0xffffffff) {
    Json::Value::Value(&local_a8,local_20->ParentIndex);
    pVVar2 = Json::Value::operator[](__return_storage_ptr__,"parentIndex");
    Json::Value::operator=(pVVar2,&local_a8);
    Json::Value::~Value(&local_a8);
  }
  bVar1 = Json::Value::empty(&local_20->ChildIndexes);
  if (!bVar1) {
    Json::Value::Value(&local_d0,&local_20->ChildIndexes);
    pVVar2 = Json::Value::operator[](__return_storage_ptr__,"childIndexes");
    Json::Value::operator=(pVVar2,&local_d0);
    Json::Value::~Value(&local_d0);
  }
  Json::Value::Value(&local_f8,&local_20->DirectoryIndexes);
  pVVar2 = Json::Value::operator[](__return_storage_ptr__,"directoryIndexes");
  Json::Value::operator=(pVVar2,&local_f8);
  Json::Value::~Value(&local_f8);
  bVar1 = Json::Value::empty(&local_20->TargetIndexes);
  if (!bVar1) {
    Json::Value::Value(&local_120,&local_20->TargetIndexes);
    pVVar2 = Json::Value::operator[](__return_storage_ptr__,"targetIndexes");
    Json::Value::operator=(pVVar2,&local_120);
    Json::Value::~Value(&local_120);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value CodemodelConfig::DumpProject(Project& p)
{
  Json::Value project = Json::objectValue;

  project["name"] = p.Snapshot.GetProjectName();

  if (p.ParentIndex != Project::NoParentIndex) {
    project["parentIndex"] = p.ParentIndex;
  }

  if (!p.ChildIndexes.empty()) {
    project["childIndexes"] = std::move(p.ChildIndexes);
  }

  project["directoryIndexes"] = std::move(p.DirectoryIndexes);

  if (!p.TargetIndexes.empty()) {
    project["targetIndexes"] = std::move(p.TargetIndexes);
  }

  return project;
}